

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall
higan::HttpServer::OnHttpRequest(HttpServer *this,TcpConnectionPtr *connection,HttpRequest *request)

{
  bool bVar1;
  HttpVersion HVar2;
  element_type *peVar3;
  FileForReadPtr *file_ptr_;
  bool local_131;
  bool local_12a;
  undefined1 local_110 [8];
  Buffer send_buffer;
  HttpResponse response;
  bool close_connection;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string connection_flag;
  HttpRequest *request_local;
  TcpConnectionPtr *connection_local;
  HttpServer *this_local;
  
  connection_flag.field_2._8_8_ = request;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Connection",&local_61);
  HttpRequest::operator[]((string *)local_40,request,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"close");
  local_12a = true;
  if (!bVar1) {
    HVar2 = HttpRequest::GetVersion((HttpRequest *)connection_flag.field_2._8_8_);
    local_131 = false;
    if (HVar2 == HTTP_VERSION_10) {
      local_131 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"Keep-Alive");
    }
    local_12a = local_131;
  }
  HttpResponse::HttpResponse((HttpResponse *)&send_buffer.write_idx_,local_12a);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->on_http_request_);
  if (bVar1) {
    std::
    function<void_(const_std::shared_ptr<higan::TcpConnection>_&,_const_higan::HttpRequest_&,_higan::HttpResponse_&)>
    ::operator()(&this->on_http_request_,connection,(HttpRequest *)connection_flag.field_2._8_8_,
                 (HttpResponse *)&send_buffer.write_idx_);
  }
  Buffer::Buffer((Buffer *)local_110);
  HttpResponse::EncodeToBuffer((HttpResponse *)&send_buffer.write_idx_,(Buffer *)local_110);
  peVar3 = std::__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)connection);
  TcpConnection::Send(peVar3,(Buffer *)local_110);
  bVar1 = HttpResponse::HasFileToResponse((HttpResponse *)&send_buffer.write_idx_);
  if (bVar1) {
    file_ptr_ = HttpResponse::GetFilePtr((HttpResponse *)&send_buffer.write_idx_);
    SendFile(this,connection,file_ptr_,local_12a);
  }
  else if (local_12a != false) {
    peVar3 = std::
             __shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)connection);
    TcpConnection::DestroyConnection(peVar3);
  }
  Buffer::~Buffer((Buffer *)local_110);
  HttpResponse::~HttpResponse((HttpResponse *)&send_buffer.write_idx_);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void HttpServer::OnHttpRequest(const TcpConnectionPtr& connection, HttpRequest& request)
{
	std::string connection_flag = request["Connection"];

	// 原本的 keep_connection逻辑写起来有点麻烦 换为了跟muduo一样的判断 close
	// 而且只有当连接为close的时候才需要进行特殊操作
	bool close_connection = connection_flag == "close" ||
			(request.GetVersion() == HttpRequest::HTTP_VERSION_10
			&& connection_flag != "Keep-Alive");

	HttpResponse response(close_connection);

	if (on_http_request_)
	{
		on_http_request_(connection, request, response);
	}

	Buffer send_buffer;
	response.EncodeToBuffer(&send_buffer);
	connection->Send(&send_buffer);

	if (!response.HasFileToResponse())
	{
		if (close_connection)
		{
			connection->DestroyConnection();
		}
	}
	else
	{
		SendFile(connection, response.GetFilePtr(), close_connection);
	}
}